

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_gc.c
# Opt level: O0

void dump_elist(char *name,zt_elist_t *p)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  zt_gc_collectable_t *in_RSI;
  char *in_RDI;
  int count;
  int c;
  zt_elist_t *tmp;
  int local_20;
  zt_gc_collectable_t *local_18;
  
  printf("%s %p [",in_RDI,in_RSI);
  bVar1 = true;
  local_20 = 0;
  for (local_18 = (zt_gc_collectable_t *)(in_RSI->list).next; local_18 != in_RSI;
      local_18 = (zt_gc_collectable_t *)(local_18->list).next) {
    if ((zt_gc_collectable_t *)(local_18->list).next == in_RSI) {
      bVar1 = false;
    }
    iVar2 = is_protected(local_18);
    if (iVar2 == 0) {
      pcVar4 = "";
      if (bVar1) {
        pcVar4 = ", ";
      }
      printf("%p%s",local_18,pcVar4);
    }
    else {
      pcVar4 = "";
      if (bVar1) {
        pcVar4 = ", ";
      }
      printf("p(%p)%s",local_18,pcVar4);
    }
    local_20 = local_20 + 1;
    if (9 < local_20) {
      sVar3 = strlen(in_RDI);
      strlen(in_RDI);
      printf("\n%*s",sVar3 + 2 & 0xffffffff,"");
      local_20 = 0;
    }
  }
  printf("]\n");
  return;
}

Assistant:

static void
dump_elist(char *name, zt_elist_t *p)
{
    zt_elist_t * tmp;
    int        c;
    int        count;

    printf("%s %p [", name, (void *)p);
    c = 1;
    count = 0;
    zt_elist_for_each(p, tmp) {
        if (tmp->next == p) {
            c = 0;
        }
        if (is_protected(zt_elist_data(tmp, zt_gc_collectable_t, list))) {
            printf("p(%p)%s", (void *)tmp, c ? ", " : "");
        } else {
            printf("%p%s", (void *)tmp, c ? ", " : "");
        }
        if (++count >= 10) {
            printf("\n" BLANK, INDENT_TO(strlen(name) + 2, 1, 0));
            count = 0;
        }
    }
    printf("]\n");
}